

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3DbStrDup(sqlite3 *db,char *z)

{
  size_t sVar1;
  size_t n;
  char *zNew;
  char *z_local;
  sqlite3 *db_local;
  
  if (z == (char *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    sVar1 = strlen(z);
    db_local = (sqlite3 *)sqlite3DbMallocRaw(db,sVar1 + 1);
    if (db_local != (sqlite3 *)0x0) {
      memcpy(db_local,z,sVar1 + 1);
    }
  }
  return (char *)db_local;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrDup(sqlite3 *db, const char *z){
  char *zNew;
  size_t n;
  if( z==0 ){
    return 0;
  }
  n = strlen(z) + 1;
  zNew = sqlite3DbMallocRaw(db, n);
  if( zNew ){
    memcpy(zNew, z, n);
  }
  return zNew;
}